

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

size_t __thiscall llama_context::state_write_data(llama_context *this,llama_io_write_i *io)

{
  pointer piVar1;
  pointer pcVar2;
  uint32_t uVar3;
  int iVar4;
  char *__s;
  undefined4 extraout_var;
  ulong uVar5;
  int32_t n_outputs;
  string arch_str;
  int local_4c;
  string local_48;
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: writing state\n","state_write_data");
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing model info\n","state_write_data");
  __s = llm_arch_name(this->model->arch);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,__s,(allocator<char> *)&local_4c);
  llama_io_write_i::write_string(io,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing output ids\n","state_write_data");
  output_reorder(this);
  local_4c = this->n_outputs;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  local_48.field_2._M_allocated_capacity = 0;
  if (local_4c <= this->n_outputs_max) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&local_48,(long)local_4c);
    if ((this->cparams).n_batch != 0) {
      piVar1 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      do {
        iVar4 = piVar1[uVar5];
        if (-1 < (long)iVar4) {
          if (local_4c <= iVar4) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                       ,0x804,"GGML_ASSERT(%s) failed","pos < n_outputs");
          }
          *(int *)(local_48._M_dataplus._M_p + (long)iVar4 * 4) = (int)uVar5;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (this->cparams).n_batch);
    }
    (*io->_vptr_llama_io_write_i[2])(io,&local_4c,4);
    if ((long)local_4c != 0) {
      (*io->_vptr_llama_io_write_i[2])(io,local_48._M_dataplus._M_p,(long)local_4c << 2);
    }
    if (local_48._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_48._M_dataplus._M_p,
                      local_48.field_2._M_allocated_capacity - (long)local_48._M_dataplus._M_p);
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing logits\n","state_write_data");
    pcVar2 = (pointer)this->logits_size;
    iVar4 = this->n_outputs;
    uVar3 = llama_vocab::n_tokens(&this->model->vocab);
    local_48._M_dataplus._M_p = (pointer)((ulong)uVar3 * (long)iVar4);
    if (pcVar2 <= local_48._M_dataplus._M_p) {
      local_48._M_dataplus._M_p = pcVar2;
    }
    (*io->_vptr_llama_io_write_i[2])(io,&local_48,8);
    if (local_48._M_dataplus._M_p != (pointer)0x0) {
      (*io->_vptr_llama_io_write_i[2])(io,this->logits,(long)local_48._M_dataplus._M_p << 2);
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing embeddings\n","state_write_data");
    local_48._M_dataplus._M_p =
         (pointer)((ulong)(this->model->hparams).n_embd * (long)this->n_outputs);
    if ((pointer)this->embd_size <= local_48._M_dataplus._M_p) {
      local_48._M_dataplus._M_p = (pointer)this->embd_size;
    }
    (*io->_vptr_llama_io_write_i[2])(io,&local_48,8);
    if (local_48._M_dataplus._M_p != (pointer)0x0) {
      (*io->_vptr_llama_io_write_i[2])(io,this->embd,(long)local_48._M_dataplus._M_p << 2);
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - writing KV self\n","state_write_data");
    llama_kv_cache_unified::state_write
              ((this->kv_self)._M_t.
               super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
               ._M_t.
               super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
               .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,io,-1);
    iVar4 = (*io->_vptr_llama_io_write_i[4])(io);
    return CONCAT44(extraout_var,iVar4);
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
             ,0x7fb,"GGML_ASSERT(%s) failed","n_outputs <= n_outputs_max");
}

Assistant:

size_t llama_context::state_write_data(llama_io_write_i & io) {
    LLAMA_LOG_DEBUG("%s: writing state\n", __func__);

    // write model info
    {
        LLAMA_LOG_DEBUG("%s: - writing model info\n", __func__);

        const std::string arch_str = llm_arch_name(model.arch);
        io.write_string(arch_str);
        // TODO: add more model-specific info which should prevent loading the session file if not identical
    }

    // write output ids
    {
        LLAMA_LOG_DEBUG("%s: - writing output ids\n", __func__);

        output_reorder();

        const auto n_outputs    = this->n_outputs;
        const auto & output_ids = this->output_ids;

        std::vector<int32_t> w_output_pos;

        GGML_ASSERT(n_outputs <= n_outputs_max);

        w_output_pos.resize(n_outputs);

        // build a more compact representation of the output ids
        for (size_t i = 0; i < n_batch(); ++i) {
            // map an output id to a position in the batch
            int32_t pos = output_ids[i];
            if (pos >= 0) {
                GGML_ASSERT(pos < n_outputs);
                w_output_pos[pos] = i;
            }
        }

        io.write(&n_outputs, sizeof(n_outputs));

        if (n_outputs) {
            io.write(w_output_pos.data(), n_outputs * sizeof(int32_t));
        }
    }

    // write logits
    {
        LLAMA_LOG_DEBUG("%s: - writing logits\n", __func__);

        const uint64_t logits_size = std::min((uint64_t) this->logits_size, (uint64_t) n_outputs * model.vocab.n_tokens());

        io.write(&logits_size, sizeof(logits_size));

        if (logits_size) {
            io.write(logits, logits_size * sizeof(float));
        }
    }

    // write embeddings
    {
        LLAMA_LOG_DEBUG("%s: - writing embeddings\n", __func__);

        const uint64_t embd_size = std::min((uint64_t) this->embd_size, (uint64_t) n_outputs * model.hparams.n_embd);

        io.write(&embd_size, sizeof(embd_size));

        if (embd_size) {
            io.write(embd, embd_size * sizeof(float));
        }
    }

    LLAMA_LOG_DEBUG("%s: - writing KV self\n", __func__);
    kv_self->state_write(io);

    return io.n_bytes();
}